

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

void avro::compileJsonSchema(istream *is,ValidSchema *schema)

{
  ulong uVar1;
  string *msg;
  ValidSchema *in_stack_ffffffffffffff98;
  ValidSchema *in_stack_ffffffffffffffa0;
  Exception *this;
  istream *in_stack_ffffffffffffffc8;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  uVar1 = std::ios::good();
  if ((uVar1 & 1) == 0) {
    msg = (string *)__cxa_allocate_exception(0x18);
    this = (Exception *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    Exception::Exception(this,msg);
    __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
  }
  compile(in_stack_ffffffffffffffc8);
  ValidSchema::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ValidSchema::~ValidSchema((ValidSchema *)0x1d9f6d);
  return;
}

Assistant:

AVRO_DECL void compileJsonSchema(std::istream &is, ValidSchema &schema)
{
    if (!is.good()) {
        throw Exception("Input stream is not good");
    }

    schema = compile(is);
}